

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O1

Vec_Int_t * updateAnteConseVectors(antecedentConsequentVectorsStruct *anteConse)

{
  Vec_Int_t *p;
  Vec_Int_t *pVVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if ((anteConse->attrAntecedents == (Vec_Int_t *)0x0) || (anteConse->attrAntecedents->nSize < 1)) {
    p = anteConse->attrConsequentCandidates;
  }
  else {
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 0;
    p->nSize = 0;
    p->pArray = (int *)0x0;
    pVVar1 = anteConse->attrConsequentCandidates;
    if (0 < pVVar1->nSize) {
      lVar4 = 0;
      do {
        lVar2 = (long)anteConse->attrAntecedents->nSize;
        if (0 < lVar2) {
          lVar3 = 0;
          do {
            if (anteConse->attrAntecedents->pArray[lVar3] == pVVar1->pArray[lVar4])
            goto LAB_005b06ba;
            lVar3 = lVar3 + 1;
          } while (lVar2 != lVar3);
        }
        Vec_IntPush(p,pVVar1->pArray[lVar4]);
LAB_005b06ba:
        lVar4 = lVar4 + 1;
        pVVar1 = anteConse->attrConsequentCandidates;
      } while (lVar4 < pVVar1->nSize);
    }
  }
  return p;
}

Assistant:

Vec_Int_t *updateAnteConseVectors(struct antecedentConsequentVectorsStruct *anteConse )
{
	Vec_Int_t *vCandMonotone;
	int iElem, i;

	//if( vKnownMonotone == NULL || Vec_IntSize(vKnownMonotone) <= 0 )
	//	return vHintMonotone;
	if( anteConse->attrAntecedents == NULL  || Vec_IntSize(anteConse->attrAntecedents) <= 0 )
		return anteConse->attrConsequentCandidates;
	vCandMonotone = Vec_IntAlloc(0);
	Vec_IntForEachEntry( anteConse->attrConsequentCandidates, iElem, i )
	{
		if( Vec_IntFind( anteConse->attrAntecedents, iElem ) == -1 )
			Vec_IntPush( vCandMonotone, iElem );
	}
	
	return vCandMonotone;
}